

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O2

void PredictorSub11_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  char *pcVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  long lVar21;
  long lVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar30 [16];
  undefined1 auVar35 [16];
  
  lVar21 = 0;
  lVar22 = 0;
  while (lVar22 + 4 <= (long)num_pixels) {
    auVar28 = *(undefined1 (*) [16])((long)upper + lVar21 + -4);
    auVar3 = *(undefined1 (*) [16])((long)upper + lVar21);
    auVar4 = *(undefined1 (*) [16])((long)in + lVar21 + -4);
    pcVar1 = (char *)((long)in + lVar21);
    cVar6 = pcVar1[1];
    cVar7 = pcVar1[2];
    cVar8 = pcVar1[3];
    cVar9 = pcVar1[4];
    cVar10 = pcVar1[5];
    cVar11 = pcVar1[6];
    cVar12 = pcVar1[7];
    cVar13 = pcVar1[8];
    cVar14 = pcVar1[9];
    cVar15 = pcVar1[10];
    cVar16 = pcVar1[0xb];
    cVar17 = pcVar1[0xc];
    cVar18 = pcVar1[0xd];
    cVar19 = pcVar1[0xe];
    cVar20 = pcVar1[0xf];
    uVar23 = auVar3._0_4_;
    uVar24 = auVar3._4_4_;
    uVar25 = auVar3._8_4_;
    uVar26 = auVar3._12_4_;
    auVar30._0_8_ = auVar28._0_8_;
    auVar30._8_4_ = auVar28._4_4_;
    auVar30._12_4_ = uVar24;
    auVar29._8_8_ = auVar30._8_8_;
    auVar29._0_4_ = auVar28._0_4_;
    auVar29._4_4_ = uVar23;
    auVar31._4_4_ = uVar23;
    auVar31._0_4_ = uVar23;
    auVar31._8_4_ = uVar24;
    auVar31._12_4_ = uVar24;
    auVar31 = psadbw(auVar29,auVar31);
    auVar32._4_4_ = uVar25;
    auVar32._0_4_ = auVar28._8_4_;
    auVar32._8_4_ = auVar28._12_4_;
    auVar32._12_4_ = uVar26;
    auVar33._4_4_ = uVar25;
    auVar33._0_4_ = uVar25;
    auVar33._8_4_ = uVar26;
    auVar33._12_4_ = uVar26;
    auVar33 = psadbw(auVar32,auVar33);
    auVar31 = packssdw(auVar31,auVar33);
    uVar23 = auVar4._0_4_;
    uVar24 = auVar4._4_4_;
    uVar25 = auVar4._8_4_;
    uVar26 = auVar4._12_4_;
    auVar35._8_4_ = auVar28._4_4_;
    auVar35._0_8_ = auVar30._0_8_;
    auVar35._12_4_ = uVar24;
    auVar34._8_8_ = auVar35._8_8_;
    auVar34._4_4_ = uVar23;
    auVar34._0_4_ = auVar29._0_4_;
    auVar5._4_4_ = uVar23;
    auVar5._0_4_ = uVar23;
    auVar5._8_4_ = uVar24;
    auVar5._12_4_ = uVar24;
    auVar33 = psadbw(auVar34,auVar5);
    auVar27._4_4_ = uVar25;
    auVar27._0_4_ = auVar28._8_4_;
    auVar27._8_4_ = auVar28._12_4_;
    auVar27._12_4_ = uVar26;
    auVar28._4_4_ = uVar25;
    auVar28._0_4_ = uVar25;
    auVar28._8_4_ = uVar26;
    auVar28._12_4_ = uVar26;
    auVar28 = psadbw(auVar27,auVar28);
    auVar28 = packssdw(auVar33,auVar28);
    auVar36._0_4_ = -(uint)(auVar31._0_4_ < auVar28._0_4_);
    auVar36._4_4_ = -(uint)(auVar31._4_4_ < auVar28._4_4_);
    auVar36._8_4_ = -(uint)(auVar31._8_4_ < auVar28._8_4_);
    auVar36._12_4_ = -(uint)(auVar31._12_4_ < auVar28._12_4_);
    auVar28 = ~auVar36 & auVar3 | auVar4 & auVar36;
    pcVar2 = (char *)((long)out + lVar21);
    *pcVar2 = *pcVar1 - auVar28[0];
    pcVar2[1] = cVar6 - auVar28[1];
    pcVar2[2] = cVar7 - auVar28[2];
    pcVar2[3] = cVar8 - auVar28[3];
    pcVar2[4] = cVar9 - auVar28[4];
    pcVar2[5] = cVar10 - auVar28[5];
    pcVar2[6] = cVar11 - auVar28[6];
    pcVar2[7] = cVar12 - auVar28[7];
    pcVar2[8] = cVar13 - auVar28[8];
    pcVar2[9] = cVar14 - auVar28[9];
    pcVar2[10] = cVar15 - auVar28[10];
    pcVar2[0xb] = cVar16 - auVar28[0xb];
    pcVar2[0xc] = cVar17 - auVar28[0xc];
    pcVar2[0xd] = cVar18 - auVar28[0xd];
    pcVar2[0xe] = cVar19 - auVar28[0xe];
    pcVar2[0xf] = cVar20 - auVar28[0xf];
    lVar21 = lVar21 + 0x10;
    lVar22 = lVar22 + 4;
  }
  if (num_pixels == (int)lVar22) {
    return;
  }
  (*VP8LPredictorsSub_C[0xb])
            ((uint32_t *)((long)in + lVar21),(uint32_t *)((long)upper + lVar21),
             num_pixels - (int)lVar22,(uint32_t *)((long)out + lVar21));
  return;
}

Assistant:

static void PredictorSub11_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i L = _mm_loadu_si128((const __m128i*)&in[i - 1]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    __m128i pa, pb;
    GetSumAbsDiff32_SSE2(&T, &TL, &pa);   // pa = sum |T-TL|
    GetSumAbsDiff32_SSE2(&L, &TL, &pb);   // pb = sum |L-TL|
    {
      const __m128i mask = _mm_cmpgt_epi32(pb, pa);
      const __m128i A = _mm_and_si128(mask, L);
      const __m128i B = _mm_andnot_si128(mask, T);
      const __m128i pred = _mm_or_si128(A, B);    // pred = (L > T)? L : T
      const __m128i res = _mm_sub_epi8(src, pred);
      _mm_storeu_si128((__m128i*)&out[i], res);
    }
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[11](in + i, upper + i, num_pixels - i, out + i);
  }
}